

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_wad.cpp
# Opt level: O3

long __thiscall FileReaderLZSS::Read(FileReaderLZSS *this,void *buffer,long len)

{
  BYTE *__dest;
  BYTE **ppBVar1;
  StreamState SVar2;
  uint uVar3;
  uint uVar4;
  ulong __n;
  void *__dest_00;
  bool bVar5;
  
  __dest = (this->Stream).Window;
  __dest_00 = buffer;
LAB_004d3f07:
  do {
    if ((this->Stream).AvailIn != 0) {
      SVar2 = (this->Stream).State;
      if (SVar2 == STREAM_EMPTY) {
        PrepareBlocks(this);
        goto LAB_004d3f07;
      }
      if (SVar2 == STREAM_BITS) {
        UncompressBlock(this);
      }
    }
    uVar3 = (this->Stream).InternalOut;
    uVar4 = (uint)len;
    if (uVar3 < (uint)len) {
      uVar4 = uVar3;
    }
    if (uVar4 != 0) {
      __n = (ulong)uVar4;
      memcpy(__dest_00,(this->Stream).WindowData,__n);
      __dest_00 = (void *)((long)__dest_00 + __n);
      len = len - __n;
      memmove(__dest,__dest + __n,(ulong)(0x1080 - uVar4));
      ppBVar1 = &(this->Stream).InternalBuffer;
      *ppBVar1 = *ppBVar1 + -__n;
      uVar3 = (this->Stream).InternalOut - uVar4;
      (this->Stream).InternalOut = uVar3;
    }
    SVar2 = (this->Stream).State;
    if (SVar2 == STREAM_FINAL) {
LAB_004d3fe6:
      if (len == 0) {
        return (long)__dest_00 - (long)buffer;
      }
      __assert_fail("AvailOut == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/resourcefiles/file_wad.cpp"
                    ,0xe0,"virtual long FileReaderLZSS::Read(void *, long)");
    }
    if ((SVar2 == STREAM_FLUSH) && (uVar3 == 0)) {
      (this->Stream).State = STREAM_EMPTY;
    }
    if ((this->Stream).AvailIn < 2) {
      FillBuffer(this);
      bVar5 = (this->Stream).State == STREAM_FINAL;
    }
    else {
      bVar5 = false;
    }
    if ((len == 0) || (bVar5)) goto LAB_004d3fe6;
  } while( true );
}

Assistant:

long Read(void *buffer, long len)
	{

		BYTE *Out = (BYTE*)buffer;
		long AvailOut = len;

		do
		{
			while(Stream.AvailIn)
			{
				if(Stream.State == STREAM_EMPTY)
					PrepareBlocks();
				else if(Stream.State == STREAM_BITS && !UncompressBlock())
					break;
				else
					break;
			}

			unsigned int copy = MIN<unsigned int>(Stream.InternalOut, AvailOut);
			if(copy > 0)
			{
				memcpy(Out, Stream.WindowData, copy);
				Out += copy;
				AvailOut -= copy;

				// Slide our window
				memmove(Stream.Window, Stream.Window+copy, WINDOW_SIZE+INTERNAL_BUFFER_SIZE-copy);
				Stream.InternalBuffer -= copy;
				Stream.InternalOut -= copy;
			}

			if(Stream.State == STREAM_FINAL)
				break;

			if(Stream.InternalOut == 0 && Stream.State == STREAM_FLUSH)
				Stream.State = STREAM_EMPTY;

			if(Stream.AvailIn < 2)
				FillBuffer();
		}
		while(AvailOut && Stream.State != STREAM_FINAL);

		assert(AvailOut == 0);
		return (long)(Out - (BYTE*)buffer);
	}